

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_cdrop_row.c
# Opt level: O1

int ilu_cdrop_row(superlu_options_t *options,int first,int last,double drop_tol,int quota,int *nnzLj
                 ,double *fill_tol,GlobalLU_t *Glu,float *swork,float *swork2,int lastc)

{
  ulong uVar1;
  singlecomplex *cx;
  void *pvVar2;
  int_t *piVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  integer iVar8;
  singlecomplex *psVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int_t *piVar17;
  long lVar18;
  float *pfVar19;
  real rVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  int n;
  singlecomplex one;
  int i_1;
  uint local_124;
  uint local_120;
  int local_11c;
  singlecomplex *local_118;
  long local_110;
  singlecomplex local_108;
  ulong local_100;
  double local_f8;
  ulong local_f0;
  float local_e8;
  float local_e4;
  float *local_e0;
  singlecomplex local_d8;
  int local_cc;
  int_t *local_c8;
  void *local_c0;
  int *local_b8;
  singlecomplex *local_b0;
  int_t *local_a8;
  int_t *local_a0;
  double local_98;
  uint local_8c;
  int local_88;
  int local_84;
  real local_80;
  integer local_7c;
  long local_78;
  double *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  double local_50;
  int_t *local_48;
  int_t *local_40;
  ulong local_38;
  
  pvVar2 = Glu->lusup;
  local_c8 = Glu->lsub;
  piVar17 = Glu->xlsub;
  piVar3 = Glu->xlusup;
  local_f8 = (double)CONCAT44(local_f8._4_4_,options->ILU_DropRule);
  local_100 = CONCAT44(local_100._4_4_,options->ILU_Norm);
  local_f0 = (ulong)options->ILU_MILU;
  local_d8.r = 1.0;
  local_d8.i = 0.0;
  local_7c = 1;
  local_98 = drop_tol;
  local_84 = quota;
  local_70 = fill_tol;
  local_50 = pow((double)Glu->n,-1.0 / options->ILU_MILU_Dim);
  iVar14 = piVar3[first];
  local_110 = (long)iVar14;
  local_78 = (long)piVar17[first];
  local_120 = piVar3[(long)first + 1] - iVar14;
  local_58 = (ulong)local_120;
  uVar7 = last - first;
  local_124 = uVar7 + 1;
  if (lastc == 0) {
    local_8c = 0;
  }
  else {
    local_8c = piVar3[(long)last + 2] - piVar3[(long)last + 1];
  }
  if ((piVar3[(long)first + 1] == iVar14) || (local_f8._0_4_ == 0 || local_120 == local_124)) {
    iVar14 = local_120 * local_124;
    local_11c = 0;
  }
  else {
    uVar12 = (ulong)(local_120 - 1);
    local_60 = (long)(int)~uVar7;
    local_e0 = swork + local_60;
    local_68 = (long)pvVar2 + -8;
    local_cc = last;
    local_b8 = nnzLj;
    local_88 = first;
    local_48 = piVar3;
    local_40 = piVar17;
    if ((int)uVar7 < (int)(local_120 - 1)) {
      local_38 = (ulong)(iVar14 - 1);
      piVar17 = (int_t *)(long)(int)uVar7;
      local_c0 = (void *)((long)pvVar2 + local_110 * 8);
      local_a8 = local_c8 + local_78;
      local_e4 = 1.0;
      local_e8 = 0.0;
      iVar14 = 0;
      iVar11 = (int)(float)local_100;
      do {
        local_118 = (singlecomplex *)((long)local_c0 + (long)piVar17 * 8 + 8);
        local_a0 = (int_t *)((long)piVar17 + 1);
        local_b0 = (singlecomplex *)((long)pvVar2 + ((long)piVar17 + local_110 + 1) * 8);
        uVar12 = (long)(int)uVar12;
        local_11c = iVar14;
        while( true ) {
          piVar17 = local_a0;
          psVar9 = local_b0;
          if (iVar11 == 1) {
            rVar20 = scnrm2_((integer *)&local_124,local_118,(integer *)&local_120);
            dVar22 = (double)(int)local_124;
            if (dVar22 < 0.0) {
              local_80 = rVar20;
              dVar22 = sqrt(dVar22);
              rVar20 = local_80;
            }
            else {
              dVar22 = SQRT(dVar22);
            }
            iVar10 = (int)local_f0;
            dVar22 = (double)rVar20 / dVar22;
          }
          else {
            if (iVar11 == 0) {
              rVar20 = scasum_((integer *)&local_124,local_118,(integer *)&local_120);
              dVar22 = (double)rVar20 / (double)(int)local_124;
            }
            else {
              iVar8 = icamax_((integer *)&local_124,local_b0,(integer *)&local_120);
              dVar22 = c_abs1(psVar9 + (long)(int)local_120 * ((long)iVar8 + -1));
            }
            iVar10 = (int)local_f0;
          }
          uVar1 = local_38;
          psVar9 = local_118;
          local_e0[(long)piVar17] = (float)dVar22;
          iVar6 = local_11c;
          if ((((ulong)local_f8 & 1) == 0) ||
             (iVar6 = iVar14, local_98 <= (double)local_e0[(long)piVar17])) break;
          if (iVar14 < 1) {
            lVar18 = local_110 + uVar12;
            psVar9 = (singlecomplex *)((long)pvVar2 + lVar18 * 8);
            cswap_((integer *)&local_124,psVar9,(integer *)&local_120,local_118,
                   (integer *)&local_120);
            if ((iVar10 == 3) && (0 < (int)local_124)) {
              iVar11 = 0;
              do {
                dVar22 = c_abs1(psVar9 + (long)(int)local_120 * (long)iVar11);
                lVar15 = (long)(int)local_120 * (long)iVar11 + lVar18;
                *(float *)((long)pvVar2 + lVar15 * 8) = (float)dVar22;
                *(undefined4 *)((long)pvVar2 + lVar15 * 8 + 4) = 0;
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)local_124);
            }
          }
          else {
            if (iVar10 - 1U < 2) {
              caxpy_((integer *)&local_124,&local_d8,local_118,(integer *)&local_120,
                     (singlecomplex *)(local_68 + ((int)local_120 + local_110) * 8),
                     (integer *)&local_120);
            }
            else if ((iVar10 == 3) && (0 < (int)local_124)) {
              iVar11 = 0;
              do {
                dVar22 = c_abs1(psVar9 + (long)(int)local_120 * (long)iVar11);
                lVar18 = (long)(int)(local_120 * iVar11 + (int)uVar1 + local_120);
                *(float *)((long)pvVar2 + lVar18 * 8) =
                     (float)((double)*(float *)((long)pvVar2 + lVar18 * 8) + dVar22);
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)local_124);
            }
            ccopy_((integer *)&local_124,(singlecomplex *)((long)local_c0 + uVar12 * 8),
                   (integer *)&local_120,psVar9,(integer *)&local_120);
          }
          iVar14 = iVar14 + 1;
          local_a8[(long)local_a0] = local_a8[uVar12];
          uVar1 = uVar12 - 1;
          bVar4 = (long)uVar12 <= (long)local_a0;
          uVar12 = uVar1;
          iVar11 = (int)(float)local_100;
          if (bVar4) {
            uVar12 = uVar1 & 0xffffffff;
            fVar23 = local_e4;
            fVar21 = local_e8;
            goto LAB_0010c519;
          }
        }
        iVar14 = iVar6;
        fVar23 = local_e0[(long)piVar17];
        fVar21 = fVar23;
        if (fVar23 <= local_e8) {
          fVar21 = local_e8;
        }
        if (local_e4 <= fVar23) {
          fVar23 = local_e4;
        }
        local_e8 = fVar21;
        local_e4 = fVar23;
      } while ((long)piVar17 < (long)(int)uVar12);
    }
    else {
      iVar14 = 0;
      fVar21 = 0.0;
      fVar23 = 1.0;
    }
LAB_0010c519:
    uVar7 = local_124;
    iVar11 = (int)uVar12;
    local_118 = (singlecomplex *)CONCAT44(local_118._4_4_,fVar21);
    local_100 = CONCAT44(local_100._4_4_,fVar23);
    dVar22 = ceil((double)local_84 / (double)(int)local_124);
    local_11c = iVar14;
    if ((((ulong)local_f8 & 0xe) != 0) && (iVar10 = (int)dVar22, iVar10 < (int)(local_120 - iVar14))
       ) {
      if ((int)uVar7 < iVar10) {
        if ((local_f8._0_4_ >> 8 & 1) == 0) {
          local_108.r = (float)((iVar11 - uVar7) + 1);
          scopy_((integer *)&local_108,swork,&local_7c,swork2,&local_7c);
          fVar21 = sqselect((int)local_108.r,swork2,iVar10 - local_124);
          dVar22 = (double)fVar21;
        }
        else {
          dVar22 = 1.0 / (double)(((float)iVar10 * (1.0 / (float)local_100 - 1.0 / local_118._0_4_))
                                  / (float)(int)(local_120 - (uVar7 + iVar14)) +
                                 1.0 / local_118._0_4_);
        }
      }
      else {
        dVar22 = (double)local_118._0_4_;
      }
      if ((int)local_124 <= iVar11) {
        uVar12 = (ulong)iVar11;
        local_a8 = (int_t *)((long)pvVar2 + local_110 * 8);
        local_c0 = (void *)CONCAT44(local_c0._4_4_,(int)local_f0 + -1);
        dVar13 = (double)(ulong)((int)local_110 - 1);
        piVar17 = local_c8 + local_78;
        uVar7 = local_124;
        do {
          lVar15 = (long)(int)uVar7 << 0x20;
          lVar18 = (long)(int)uVar7 + -1;
          iVar14 = uVar7 + (int)local_110;
          while (dVar22 < (double)local_e0[lVar18 + 1]) {
            lVar15 = lVar15 + 0x100000000;
            lVar18 = lVar18 + 1;
            iVar14 = iVar14 + 1;
            uVar7 = uVar7 + 1;
            if ((long)uVar12 <= lVar18) goto LAB_0010c636;
          }
          psVar9 = (singlecomplex *)(long)iVar14;
          iVar11 = (int)local_f0;
          local_100 = uVar12;
          local_f8 = dVar13;
          local_a0 = piVar17;
          local_98 = dVar22;
          if (local_11c < 1) {
            local_118 = (singlecomplex *)(local_110 + uVar12);
            cx = (singlecomplex *)((long)pvVar2 + (long)local_118 * 8);
            cswap_((integer *)&local_124,cx,(integer *)&local_120,
                   (singlecomplex *)((long)pvVar2 + (long)psVar9 * 8),(integer *)&local_120);
            if ((iVar11 == 3) && (0 < (int)local_124)) {
              iVar14 = 0;
              do {
                dVar22 = c_abs1(cx + (long)(int)local_120 * (long)iVar14);
                lVar16 = (long)(int)local_120 * (long)iVar14 + (long)local_118;
                *(float *)((long)pvVar2 + lVar16 * 8) = (float)dVar22;
                *(undefined4 *)((long)pvVar2 + lVar16 * 8 + 4) = 0;
                iVar14 = iVar14 + 1;
              } while (iVar14 < (int)local_124);
            }
          }
          else {
            local_b0 = psVar9;
            if ((uint)local_c0 < 2) {
              caxpy_((integer *)&local_124,&local_d8,
                     (singlecomplex *)((long)pvVar2 + (long)psVar9 * 8),(integer *)&local_120,
                     (singlecomplex *)(local_68 + ((int)local_120 + local_110) * 8),
                     (integer *)&local_120);
            }
            else if ((iVar11 == 3) && (0 < (int)local_124)) {
              iVar11 = 0;
              do {
                dVar22 = c_abs1((singlecomplex *)
                                ((long)pvVar2 + (long)(int)(local_120 * iVar11 + iVar14) * 8));
                lVar16 = (long)(int)(local_120 * iVar11 + SUB84(local_f8,0) + local_120);
                *(float *)((long)pvVar2 + lVar16 * 8) =
                     (float)((double)*(float *)((long)pvVar2 + lVar16 * 8) + dVar22);
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)local_124);
            }
            ccopy_((integer *)&local_124,(singlecomplex *)(local_a8 + local_100 * 2),
                   (integer *)&local_120,(singlecomplex *)((long)pvVar2 + (long)local_b0 * 8),
                   (integer *)&local_120);
          }
          local_11c = local_11c + 1;
          local_c8[(int)((int)local_78 + uVar7)] = local_a0[local_100];
          uVar12 = local_100 - 1;
          local_e0[lVar18 + 1] = local_e0[local_100 - 1];
          dVar13 = local_f8;
          piVar17 = local_a0;
          dVar22 = local_98;
        } while (lVar15 >> 0x20 < (long)local_100);
      }
    }
LAB_0010c636:
    uVar5 = local_120;
    uVar7 = local_124;
    if ((int)local_124 < (int)local_120) {
      memset(swork + local_60 + (int)local_124,0,(ulong)(~local_124 + local_120) * 4 + 4);
    }
    if (local_11c == 0) {
      iVar14 = uVar5 * uVar7;
      local_11c = 0;
      nnzLj = local_b8;
    }
    else {
      if ((int)local_f0 != 0) {
        if ((int)local_124 < 1) {
          local_100 = 0;
        }
        else {
          iVar11 = (int)local_58;
          iVar14 = (int)local_110;
          local_118 = (singlecomplex *)
                      ((1.0 - (double)(float)local_50) + (1.0 - (double)(float)local_50));
          pfVar19 = (float *)((long)pvVar2 + local_110 * 8 + 4);
          lVar18 = 0;
          local_100 = local_100 & 0xffffffff00000000;
          do {
            local_108 = *(singlecomplex *)
                         ((long)pvVar2 +
                         (long)(int)(local_120 + iVar14 + -1 + (int)lVar18 * local_120) * 8);
            if ((local_108.r != 0.0) || (NAN(local_108.r))) {
LAB_0010c72b:
              dVar22 = c_abs1(&local_108);
              fVar21 = 1.0;
              if ((double)local_118 / dVar22 < 1.0) {
                dVar22 = c_abs1(&local_108);
                fVar21 = (float)((double)local_118 / dVar22);
              }
              fVar23 = local_108.r * fVar21;
              local_108.i = fVar21 * local_108.i;
              local_108.r = fVar23;
              iVar10 = (int)local_f0;
              if (iVar10 == 3) {
                fVar21 = pfVar19[-1];
                pfVar19[-1] = fVar21 * (fVar23 + local_d8.r) - (local_108.i + local_d8.i) * *pfVar19
                ;
                *pfVar19 = (fVar23 + local_d8.r) * *pfVar19 + (local_108.i + local_d8.i) * fVar21;
              }
              else if (iVar10 == 2) {
                local_f8 = (double)pfVar19[-1];
                dVar22 = c_abs1(&local_108);
                pfVar19[-1] = (float)((dVar22 + 1.0) * local_f8);
                local_f8 = (double)*pfVar19;
                dVar22 = c_abs1(&local_108);
                *pfVar19 = (float)((dVar22 + 1.0) * local_f8);
              }
              else if (iVar10 == 1) {
                if ((((fVar23 != -1.0) || (NAN(fVar23))) || (local_108.i != 0.0)) ||
                   (NAN(local_108.i))) {
                  fVar21 = pfVar19[-1];
                  pfVar19[-1] = fVar21 * (fVar23 + local_d8.r) -
                                (local_108.i + local_d8.i) * *pfVar19;
                  *pfVar19 = (fVar23 + local_d8.r) * *pfVar19 + (local_108.i + local_d8.i) * fVar21;
                }
                else {
                  dVar22 = *local_70;
                  pfVar19[-1] = (float)((double)pfVar19[-1] * dVar22);
                  *pfVar19 = (float)((double)*pfVar19 * dVar22);
                  local_100 = CONCAT44(local_100._4_4_,(int)(float)local_100 + 1);
                }
              }
            }
            else if ((local_108.i != 0.0) || (NAN(local_108.i))) goto LAB_0010c72b;
            lVar18 = lVar18 + 1;
            pfVar19 = pfVar19 + (long)(iVar11 + 1) * 2;
          } while (lVar18 < (int)local_124);
        }
        if (0 < (int)(float)local_100) {
          *local_70 = (double)-(int)(float)local_100;
        }
      }
      uVar7 = local_120 - local_11c;
      if (1 < (long)(int)local_124) {
        lVar18 = local_110 * 8 + (long)(int)local_120 * 8 + (long)pvVar2;
        lVar15 = (long)(int)uVar7 * 8 + local_110 * 8 + (long)pvVar2;
        lVar16 = 1;
        do {
          if (0 < (int)uVar7) {
            uVar12 = 0;
            do {
              *(undefined8 *)(lVar15 + uVar12 * 8) = *(undefined8 *)(lVar18 + uVar12 * 8);
              uVar12 = uVar12 + 1;
            } while (uVar7 != uVar12);
          }
          lVar16 = lVar16 + 1;
          lVar18 = lVar18 + (long)(int)local_120 * 8;
          lVar15 = lVar15 + (long)(int)uVar7 * 8;
        } while (lVar16 != (int)local_124);
      }
      if (0 < (int)local_8c) {
        uVar12 = 0;
        do {
          *(undefined8 *)
           ((long)pvVar2 + uVar12 * 8 + (long)(int)(uVar7 * local_124) * 8 + local_110 * 8) =
               *(undefined8 *)
                ((long)pvVar2 + uVar12 * 8 + (long)(int)(local_120 * local_124) * 8 + local_110 * 8)
          ;
          uVar12 = uVar12 + 1;
        } while (local_8c != uVar12);
      }
      if (0 < (int)local_8c) {
        lVar18 = 0;
        do {
          local_c8[(local_40[(long)local_cc + 1] - local_11c) + (int)lVar18] =
               local_c8[lVar18 + local_40[(long)local_cc + 1]];
          lVar18 = lVar18 + 1;
        } while (local_8c != (uint)lVar18);
      }
      if (local_88 <= local_cc) {
        lVar18 = (long)(local_88 + 1) + -1;
        iVar14 = -local_11c;
        do {
          local_48[lVar18 + 1] = local_48[lVar18 + 1] + iVar14;
          local_40[lVar18 + 1] = local_40[lVar18 + 1] - local_11c;
          lVar18 = lVar18 + 1;
          iVar14 = iVar14 - local_11c;
        } while (lVar18 <= local_cc);
      }
      if (lastc != 0) {
        local_48[(long)local_cc + 2] = local_48[(long)local_cc + 2] - local_124 * local_11c;
        local_40[(long)local_cc + 2] = local_40[(long)local_cc + 2] - local_11c;
      }
      iVar14 = (local_120 - local_11c) * local_124;
      nnzLj = local_b8;
    }
  }
  *nnzLj = *nnzLj + iVar14;
  return local_11c;
}

Assistant:

int ilu_cdrop_row(
	superlu_options_t *options, /* options */
	int    first,	    /* index of the first column in the supernode */
	int    last,	    /* index of the last column in the supernode */
	double drop_tol,    /* dropping parameter */
	int    quota,	    /* maximum nonzero entries allowed */
	int    *nnzLj,	    /* in/out number of nonzeros in L(:, 1:last) */
	double *fill_tol,   /* in/out - on exit, fill_tol=-num_zero_pivots,
			     * does not change if options->ILU_MILU != SMILU1 */
	GlobalLU_t *Glu,    /* modified */
	float swork[],   /* working space
	                     * the length of swork[] should be no less than
			     * the number of rows in the supernode */
	float swork2[], /* working space with the same size as swork[],
			     * used only by the second dropping rule */
	int    lastc	    /* if lastc == 0, there is nothing after the
			     * working supernode [first:last];
			     * if lastc == 1, there is one more column after
			     * the working supernode. */ )
{
    register int i, j, k, m1;
    register int nzlc; /* number of nonzeros in column last+1 */
    int_t xlusup_first, xlsub_first;
    int m, n; /* m x n is the size of the supernode */
    int r = 0; /* number of dropped rows */
    register float *temp;
    register singlecomplex *lusup = (singlecomplex *) Glu->lusup;
    int_t *lsub = Glu->lsub;
    int_t *xlsub = Glu->xlsub;
    int_t *xlusup = Glu->xlusup;
    register float d_max = 0.0, d_min = 1.0;
    int    drop_rule = options->ILU_DropRule;
    milu_t milu = options->ILU_MILU;
    norm_t nrm = options->ILU_Norm;
    singlecomplex one = {1.0, 0.0};
    singlecomplex none = {-1.0, 0.0};
    int i_1 = 1;
    int inc_diag; /* inc_diag = m + 1 */
    int nzp = 0;  /* number of zero pivots */
    float alpha = pow((double)(Glu->n), -1.0 / options->ILU_MILU_Dim);

    xlusup_first = xlusup[first];
    xlsub_first = xlsub[first];
    m = xlusup[first + 1] - xlusup_first;
    n = last - first + 1;
    m1 = m - 1;
    inc_diag = m + 1;
    nzlc = lastc ? (xlusup[last + 2] - xlusup[last + 1]) : 0;
    temp = swork - n;

    /* Quick return if nothing to do. */
    if (m == 0 || m == n || drop_rule == NODROP)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* basic dropping: ILU(tau) */
    for (i = n; i <= m1; )
    {
	/* the average abs value of ith row */
	switch (nrm)
	{
	    case ONE_NORM:
		temp[i] = scasum_(&n, &lusup[xlusup_first + i], &m) / (double)n;
		break;
	    case TWO_NORM:
		temp[i] = scnrm2_(&n, &lusup[xlusup_first + i], &m)
		    / sqrt((double)n);
		break;
	    case INF_NORM:
	    default:
		k = icamax_(&n, &lusup[xlusup_first + i], &m) - 1;
		temp[i] = c_abs1(&lusup[xlusup_first + i + m * k]);
		break;
	}

	/* drop small entries due to drop_tol */
	if (drop_rule & DROP_BASIC && temp[i] < drop_tol)
	{
	    r++;
	    /* drop the current row and move the last undropped row here */
	    if (r > 1) /* add to last row */
	    {
		/* accumulate the sum (for MILU) */
		switch (milu)
		{
		    case SMILU_1:
		    case SMILU_2:
			caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				&lusup[xlusup_first + m - 1], &m);
			break;
		    case SMILU_3:
			for (j = 0; j < n; j++)
			    lusup[xlusup_first + (m - 1) + j * m].r +=
				    c_abs1(&lusup[xlusup_first + i + j * m]);
			break;
		    case SILU:
		    default:
			break;
		}
		ccopy_(&n, &lusup[xlusup_first + m1], &m,
                       &lusup[xlusup_first + i], &m);
	    } /* if (r > 1) */
	    else /* move to last row */
	    {
		cswap_(&n, &lusup[xlusup_first + m1], &m,
			&lusup[xlusup_first + i], &m);
		if (milu == SMILU_3)
		    for (j = 0; j < n; j++) {
			lusup[xlusup_first + m1 + j * m].r =
				c_abs1(&lusup[xlusup_first + m1 + j * m]);
			lusup[xlusup_first + m1 + j * m].i = 0.0;
                    }
	    }
	    lsub[xlsub_first + i] = lsub[xlsub_first + m1];
	    m1--;
	    continue;
	} /* if dropping */
	else
	{
	    if (temp[i] > d_max) d_max = temp[i];
	    if (temp[i] < d_min) d_min = temp[i];
	}
	i++;
    } /* for */

    /* Secondary dropping: drop more rows according to the quota. */
    quota = ceil((double)quota / (double)n);
    if (drop_rule & DROP_SECONDARY && m - r > quota)
    {
	register double tol = d_max;

	/* Calculate the second dropping tolerance */
	if (quota > n)
	{
	    if (drop_rule & DROP_INTERP) /* by interpolation */
	    {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / (m - n - r));
	    }
	    else /* by quick select */
	    {
		int len = m1 - n + 1;
		scopy_(&len, swork, &i_1, swork2, &i_1);
		tol = sqselect(len, swork2, quota - n);
#if 0
		register int *itemp = iwork - n;
		A = temp;
		for (i = n; i <= m1; i++) itemp[i] = i;
		qsort(iwork, m1 - n + 1, sizeof(int), _compare_);
		tol = temp[itemp[quota]];
#endif
	    }
	}

	for (i = n; i <= m1; )
	{
	    if (temp[i] <= tol)
	    {
		register int j;
		r++;
		/* drop the current row and move the last undropped row here */
		if (r > 1) /* add to last row */
		{
		    /* accumulate the sum (for MILU) */
		    switch (milu)
		    {
			case SMILU_1:
			case SMILU_2:
			    caxpy_(&n, &one, &lusup[xlusup_first + i], &m,
				    &lusup[xlusup_first + m - 1], &m);
			    break;
			case SMILU_3:
			    for (j = 0; j < n; j++)
				lusup[xlusup_first + (m - 1) + j * m].r +=
   				  c_abs1(&lusup[xlusup_first + i + j * m]);
			    break;
			case SILU:
			default:
			    break;
		    }
		    ccopy_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		} /* if (r > 1) */
		else /* move to last row */
		{
		    cswap_(&n, &lusup[xlusup_first + m1], &m,
			    &lusup[xlusup_first + i], &m);
		    if (milu == SMILU_3)
			for (j = 0; j < n; j++) {
			    lusup[xlusup_first + m1 + j * m].r =
				    c_abs1(&lusup[xlusup_first + m1 + j * m]);
			    lusup[xlusup_first + m1 + j * m].i = 0.0;
                        }
		}
		lsub[xlsub_first + i] = lsub[xlsub_first + m1];
		m1--;
		temp[i] = temp[m1];

		continue;
	    }
	    i++;

	} /* for */

    } /* if secondary dropping */

    for (i = n; i < m; i++) temp[i] = 0.0;

    if (r == 0)
    {
	*nnzLj += m * n;
	return 0;
    }

    /* add dropped entries to the diagonal */
    if (milu != SILU)
    {
	register int j;
	singlecomplex t;
	float omega;
	for (j = 0; j < n; j++)
	{
	    t = lusup[xlusup_first + (m - 1) + j * m];
            if (t.r == 0.0 && t.i == 0.0) continue;
            omega = SUPERLU_MIN(2.0 * (1.0 - alpha) / c_abs1(&t), 1.0);
	    cs_mult(&t, &t, omega);

 	    switch (milu)
	    {
		case SMILU_1:
		    if ( !(c_eq(&t, &none)) ) {
                        c_add(&t, &t, &one);
                        cc_mult(&lusup[xlusup_first + j * inc_diag],
			                  &lusup[xlusup_first + j * inc_diag],
                                          &t);
                    }
		    else
		    {
                        cs_mult(
                                &lusup[xlusup_first + j * inc_diag],
			        &lusup[xlusup_first + j * inc_diag],
                                *fill_tol);
#ifdef DEBUG
			printf("[1] ZERO PIVOT: FILL col %d.\n", first + j);
			fflush(stdout);
#endif
			nzp++;
		    }
		    break;
		case SMILU_2:
                    cs_mult(&lusup[xlusup_first + j * inc_diag],
                                          &lusup[xlusup_first + j * inc_diag],
                                          1.0 + c_abs1(&t));
		    break;
		case SMILU_3:
                    c_add(&t, &t, &one);
                    cc_mult(&lusup[xlusup_first + j * inc_diag],
	                              &lusup[xlusup_first + j * inc_diag],
                                      &t);
		    break;
		case SILU:
		default:
		    break;
	    }
	}
	if (nzp > 0) *fill_tol = -nzp;
    }

    /* Remove dropped entries from the memory and fix the pointers. */
    m1 = m - r;
    for (j = 1; j < n; j++)
    {
	register int tmp1, tmp2;
	tmp1 = xlusup_first + j * m1;
	tmp2 = xlusup_first + j * m;
	for (i = 0; i < m1; i++)
	    lusup[i + tmp1] = lusup[i + tmp2];
    }
    for (i = 0; i < nzlc; i++)
	lusup[xlusup_first + i + n * m1] = lusup[xlusup_first + i + n * m];
    for (i = 0; i < nzlc; i++)
	lsub[xlsub[last + 1] - r + i] = lsub[xlsub[last + 1] + i];
    for (i = first + 1; i <= last + 1; i++)
    {
	xlusup[i] -= r * (i - first);
	xlsub[i] -= r;
    }
    if (lastc)
    {
	xlusup[last + 2] -= r * n;
	xlsub[last + 2] -= r;
    }

    *nnzLj += (m - r) * n;
    return r;
}